

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_partitioned_aggregate.cpp
# Opt level: O2

SinkFinalizeType __thiscall
duckdb::PhysicalPartitionedAggregate::Finalize
          (PhysicalPartitionedAggregate *this,Pipeline *pipeline,Event *event,ClientContext *context
          ,OperatorSinkFinalizeInput *input)

{
  mutex *this_00;
  GlobalSinkState *pGVar1;
  vector<duckdb::Value,_true> *this_01;
  reference this_02;
  const_reference value;
  pointer this_03;
  idx_t partition_idx;
  ulong __n;
  pointer pIVar2;
  DataChunk chunk;
  ColumnDataAppendState append_state;
  DataChunk DStack_c8;
  ColumnDataAppendState local_88;
  
  pGVar1 = input->global_state;
  local_88.current_chunk_state.handles._M_h._M_buckets =
       &local_88.current_chunk_state.handles._M_h._M_single_bucket;
  local_88.current_chunk_state.handles._M_h._M_bucket_count = 1;
  local_88.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88.current_chunk_state.handles._M_h._M_element_count = 0;
  local_88.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_88.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  local_88.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_88.current_chunk_state.properties = INVALID;
  local_88.vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &pGVar1[2].super_StateWithBlockableTasks.lock;
  ColumnDataCollection::InitializeAppend((ColumnDataCollection *)this_00,&local_88);
  DataChunk::DataChunk(&DStack_c8);
  DataChunk::Initialize(&DStack_c8,context,&(this->super_PhysicalOperator).types,0x800);
  pIVar2 = (pointer)((long)&pGVar1[1].super_StateWithBlockableTasks.blocked_tasks.
                            super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                            .
                            super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                            ._M_impl.super__Vector_impl_data + 8);
  while (pIVar2 = *(pointer *)pIVar2, pIVar2 != (pointer)0x0) {
    DataChunk::Reset(&DStack_c8);
    this_01 = StructValue::GetChildren((Value *)&pIVar2->current_task);
    for (__n = 0; __n < (ulong)((long)(this_01->
                                      super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_01->
                                      super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 6); __n = __n + 1
        ) {
      this_02 = vector<duckdb::Vector,_true>::get<true>(&DStack_c8.data,__n);
      value = vector<duckdb::Value,_true>::get<true>(this_01,__n);
      Vector::Reference(this_02,value);
    }
    this_03 = unique_ptr<duckdb::GlobalUngroupedAggregateState,_std::default_delete<duckdb::GlobalUngroupedAggregateState>,_true>
              ::operator->((unique_ptr<duckdb::GlobalUngroupedAggregateState,_std::default_delete<duckdb::GlobalUngroupedAggregateState>,_true>
                            *)&pIVar2[1].signal_state.internal.
                               super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
    GlobalUngroupedAggregateState::Finalize
              (this_03,&DStack_c8,
               (long)(this_01->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this_01->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_start >> 6);
    ColumnDataCollection::Append((ColumnDataCollection *)this_00,&local_88,&DStack_c8);
  }
  DataChunk::~DataChunk(&DStack_c8);
  ColumnDataAppendState::~ColumnDataAppendState(&local_88);
  return READY;
}

Assistant:

SinkFinalizeType PhysicalPartitionedAggregate::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                                        OperatorSinkFinalizeInput &input) const {
	auto &gstate = input.global_state.Cast<PartitionedAggregateGlobalSinkState>();
	ColumnDataAppendState append_state;
	gstate.aggregate_result.InitializeAppend(append_state);
	// finalize each of the partitions and append to a ColumnDataCollection
	DataChunk chunk;
	chunk.Initialize(context, types);
	for (auto &entry : gstate.aggregate_states) {
		chunk.Reset();
		// reference the partitions
		auto &partitions = StructValue::GetChildren(entry.first);
		for (idx_t partition_idx = 0; partition_idx < partitions.size(); partition_idx++) {
			chunk.data[partition_idx].Reference(partitions[partition_idx]);
		}
		// finalize the aggregates
		entry.second->Finalize(chunk, partitions.size());

		// append to the CDC
		gstate.aggregate_result.Append(append_state, chunk);
	}
	return SinkFinalizeType::READY;
}